

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O3

void __thiscall
ServerService::startControlServiceWithResult
          (ServerService *this,int fd,_func_byte_ptr_int_byte_ptr *pFunction)

{
  int recvWindowSize;
  uint __fd;
  int socketFD;
  ServerSegment *pSVar1;
  size_t sVar2;
  byte *pbVar3;
  long lVar4;
  sockaddr *psVar5;
  ServerService *this_00;
  undefined8 *puVar6;
  byte bVar7;
  socklen_t clientLength;
  sockaddr_storage clientDetails;
  byte buffer [1472];
  sockaddr_storage in_stack_fffffffffffff8f8;
  socklen_t local_67c;
  sockaddr local_678 [8];
  byte local_5f8 [1480];
  
  bVar7 = 0;
  memset(local_5f8,0,0x5c0);
  local_67c = 0x80;
  __fd = ServerSocketUDP::getSocket(this->serverSocketUDP);
  this_00 = (ServerService *)(ulong)__fd;
  recvfrom(__fd,local_5f8,0x5c0,0,local_678,&local_67c);
  pSVar1 = parseRequest(this_00,local_5f8);
  if ((pSVar1->data != (byte *)0x0) && (pSVar1->ackFlag == 'N')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"received: ",10);
    pbVar3 = pSVar1->data;
    if (pbVar3 == (byte *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x109160);
    }
    else {
      sVar2 = strlen((char *)pbVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)pbVar3,sVar2)
      ;
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    std::ostream::put('`');
    std::ostream::flush();
    pbVar3 = (*pFunction)(fd,pSVar1->data);
    socketFD = ServerSocketUDP::getSocket(this->serverSocketUDP);
    recvWindowSize = this->receiverWindowSize;
    psVar5 = local_678;
    puVar6 = (undefined8 *)&stack0xfffffffffffff8f8;
    for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar6 = *(undefined8 *)psVar5;
      psVar5 = (sockaddr *)(psVar5[-(ulong)bVar7].sa_data + 6);
      puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
    }
    sendSegments(this,pbVar3,socketFD,in_stack_fffffffffffff8f8,recvWindowSize);
  }
  return;
}

Assistant:

void ServerService::startControlServiceWithResult(int fd, byte* (* pFunction)(int, byte* )) {
    socklen_t clientLength;
    struct sockaddr_storage clientDetails;
    byte buffer[MTU];
    bzero(buffer, MTU);
    clientLength = sizeof(clientDetails);
    recvfrom(serverSocketUDP->getSocket(), buffer, MTU, 0, (struct sockaddr *) &clientDetails, &clientLength);
    ServerSegment *segment = parseRequest(buffer);

    if (segment->data && segment->ackFlag == 'N') {
        cout << "received: ";
        cout << (char *) segment->data << endl;
        sendSegments(pFunction(fd, segment->data), serverSocketUDP->getSocket(), clientDetails, receiverWindowSize);
    }
}